

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

void __thiscall
despot::AEMS::AEMS(AEMS *this,DSPOMDP *model,BeliefLowerBound *lower_bound,
                  BeliefUpperBound *upper_bound,Belief *belief)

{
  Belief *belief_local;
  BeliefUpperBound *upper_bound_local;
  BeliefLowerBound *lower_bound_local;
  DSPOMDP *model_local;
  AEMS *this_local;
  
  Solver::Solver(&this->super_Solver,model,belief);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__AEMS_0026efa8;
  this->root_ = (VNode *)0x0;
  this->lower_bound_ = lower_bound;
  this->upper_bound_ = upper_bound;
  SearchStatistics::SearchStatistics(&this->statistics_);
  this->model_ = (BeliefMDP *)model;
  this->reuse_ = false;
  return;
}

Assistant:

AEMS::AEMS(const DSPOMDP* model, BeliefLowerBound* lower_bound,
	BeliefUpperBound* upper_bound, Belief* belief) :
	Solver(model, belief),
	root_(NULL),
	lower_bound_(lower_bound),
	upper_bound_(upper_bound) {
	model_ = static_cast<const BeliefMDP*>(model);
	reuse_ = false;
}